

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.h
# Opt level: O0

DoubleVector * __thiscall CoreML::Specification::Imputer::mutable_imputeddoublearray(Imputer *this)

{
  bool bVar1;
  DoubleVector *this_00;
  Imputer *this_local;
  
  bVar1 = has_imputeddoublearray(this);
  if (!bVar1) {
    clear_ImputedValue(this);
    set_has_imputeddoublearray(this);
    this_00 = (DoubleVector *)operator_new(0x28);
    DoubleVector::DoubleVector(this_00);
    (this->ImputedValue_).imputeddoublearray_ = this_00;
  }
  return (DoubleVector *)(this->ImputedValue_).imputeddoublevalue_;
}

Assistant:

inline ::CoreML::Specification::DoubleVector* Imputer::mutable_imputeddoublearray() {
  if (!has_imputeddoublearray()) {
    clear_ImputedValue();
    set_has_imputeddoublearray();
    ImputedValue_.imputeddoublearray_ = new ::CoreML::Specification::DoubleVector;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Imputer.imputedDoubleArray)
  return ImputedValue_.imputeddoublearray_;
}